

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Matcher::DoSaveInnerGroups
          (Matcher *this,int fromGroupId,int toGroupId,bool reset,Char *input,ContStack *contStack)

{
  GroupInfo *pGVar1;
  PageAllocation *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  size_t sVar6;
  uint fromGroupId_00;
  
  if (fromGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10b,"(fromGroupId >= 0)","fromGroupId >= 0");
    if (!bVar4) goto LAB_00edfb5f;
    *puVar5 = 0;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10c,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar4) goto LAB_00edfb5f;
    *puVar5 = 0;
  }
  if (toGroupId < fromGroupId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x10d,"(fromGroupId <= toGroupId)","fromGroupId <= toGroupId");
    if (!bVar4) goto LAB_00edfb5f;
    *puVar5 = 0;
  }
  else {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  fromGroupId_00 = 0xffffffff;
  do {
    if ((fromGroupId < 0) || ((uint)((this->program).ptr)->numGroups <= (uint)fromGroupId)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                         ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                         "groupId >= 0 && groupId < program->numGroups");
      if (!bVar4) goto LAB_00edfb5f;
      *puVar5 = 0;
    }
    pGVar1 = (this->groupInfos).ptr;
    if (pGVar1[fromGroupId].length == 0xffffffff) {
      if ((int)fromGroupId_00 < 0) {
        fromGroupId_00 = fromGroupId;
      }
    }
    else {
      if (-1 < (int)fromGroupId_00) {
        if (fromGroupId < 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar5 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                             ,0x11f,"(groupId > 0)","groupId > 0");
          if (!bVar4) goto LAB_00edfb5f;
          *puVar5 = 0;
        }
        DoSaveInnerGroups_AllUndefined(this,fromGroupId_00,fromGroupId - 1,input,contStack);
        fromGroupId_00 = 0xffffffff;
      }
      sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.bufferSize;
      if (sVar6 - (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                  super_ContinuousPageStack<1UL>.nextTop < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
        sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
                super_ContinuousPageStack<1UL>.bufferSize;
      }
      if (sVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                           ,199,"(bufferSize)","bufferSize");
        if (!bVar4) goto LAB_00edfb5f;
        *puVar5 = 0;
      }
      pPVar2 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar6 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar6 + 0x20;
      *(size_t *)((long)&pPVar2[1].pageCount + sVar6) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      *(undefined1 *)((long)&pPVar2[2].pageCount + sVar6) = 2;
      *(undefined ***)((long)&pPVar2[1].segment + sVar6) = &PTR_Print_015432d8;
      *(int *)((long)&pPVar2[2].pageCount + sVar6 + 4) = fromGroupId;
      *(GroupInfo *)((long)&pPVar2[2].segment + sVar6) = pGVar1[fromGroupId];
      PushStats(this,contStack,input);
      if (reset) {
        pGVar1[fromGroupId].length = 0xffffffff;
      }
    }
    fromGroupId = fromGroupId + 1;
  } while (fromGroupId <= toGroupId);
  if ((int)fromGroupId_00 < 0) {
    return;
  }
  if (toGroupId < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x130,"(toGroupId >= 0)","toGroupId >= 0");
    if (!bVar4) {
LAB_00edfb5f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  DoSaveInnerGroups_AllUndefined(this,fromGroupId_00,toGroupId,input,contStack);
  return;
}

Assistant:

void Matcher::DoSaveInnerGroups(
        const int fromGroupId,
        const int toGroupId,
        const bool reset,
        const Char *const input,
        ContStack &contStack)
    {
        Assert(fromGroupId >= 0);
        Assert(toGroupId >= 0);
        Assert(fromGroupId <= toGroupId);

        int undefinedRangeFromId = -1;
        int groupId = fromGroupId;
        do
        {
            GroupInfo *const groupInfo = GroupIdToGroupInfo(groupId);
            if (groupInfo->IsUndefined())
            {
                if (undefinedRangeFromId < 0)
                {
                    undefinedRangeFromId = groupId;
                }
                continue;
            }

            if (undefinedRangeFromId >= 0)
            {
                Assert(groupId > 0);
                DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, groupId - 1, input, contStack);
                undefinedRangeFromId = -1;
            }

            PUSH(contStack, RestoreGroupCont, groupId, *groupInfo);
#if ENABLE_REGEX_CONFIG_OPTIONS
            PushStats(contStack, input);
#endif

            if (reset)
            {
                groupInfo->Reset();
            }
        } while (++groupId <= toGroupId);
        if (undefinedRangeFromId >= 0)
        {
            Assert(toGroupId >= 0);
            DoSaveInnerGroups_AllUndefined(undefinedRangeFromId, toGroupId, input, contStack);
        }
    }